

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl.cpp
# Opt level: O3

int LiveGLSLRender(LiveGLSL *live_glsl)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pcVar5;
  pointer pGVar6;
  undefined4 uVar8;
  pointer pTVar7;
  undefined4 uVar9;
  HGUI handle;
  size_t __n;
  double dVar10;
  bool bVar11;
  long *plVar12;
  uint32_t *puVar13;
  PFNGLGETUNIFORMLOCATIONPROC p_Var14;
  PFNGLUNIFORM1FPROC p_Var15;
  PFNGLUNIFORM1IPROC p_Var16;
  PFNGLUNIFORM2FPROC p_Var17;
  PFNGLUNIFORM3FPROC p_Var18;
  int iVar19;
  GLint GVar20;
  int iVar21;
  GLuint GVar22;
  void *data;
  uint32_t *puVar23;
  pointer pRVar24;
  GUIComponent *gui_component;
  pointer pGVar25;
  pointer pRVar26;
  RenderPass *other;
  pointer pTVar27;
  pointer pRVar28;
  GLsizei y_00;
  RenderPass *render_pass;
  float fVar29;
  float fVar30;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range3;
  vector<GUITexture,_std::allocator<GUITexture>_> textures;
  double y;
  double x;
  GUITexture local_f0;
  long local_e0 [2];
  int local_cc;
  pointer local_c8;
  GLfloat local_bc;
  vector<GUITexture,_std::allocator<GUITexture>_> local_b8;
  double local_98;
  double local_90;
  string *local_88;
  uint32_t *local_80;
  uint32_t *local_78;
  pointer local_70;
  vector<GUITexture,_std::allocator<GUITexture>_> local_68;
  string local_50;
  
  glfwGetTime();
  local_78 = (uint32_t *)&live_glsl->WindowWidth;
  local_80 = (uint32_t *)&live_glsl->WindowHeight;
  local_88 = &(live_glsl->Args).Output;
  do {
    iVar19 = glfwWindowShouldClose(live_glsl->GLFWWindowHandle);
    if (iVar19 != 0) {
      return 0;
    }
    pcVar5 = (live_glsl->ShaderPath)._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar5,pcVar5 + (live_glsl->ShaderPath)._M_string_length);
    ReloadShaderIfChanged(live_glsl,&local_50,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    glfwGetCursorPos(live_glsl->GLFWWindowHandle,&local_90,&local_98);
    local_90 = local_90 * (double)live_glsl->PixelDensity;
    local_98 = (double)live_glsl->PixelDensity * local_98;
    iVar19 = glfwGetMouseButton(live_glsl->GLFWWindowHandle,0);
    if (live_glsl->ShaderCompiled == true) {
      pGVar6 = (live_glsl->GUIComponents).
               super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pGVar25 = (live_glsl->GUIComponents).
                     super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                     super__Vector_impl_data._M_start; pGVar25 != pGVar6; pGVar25 = pGVar25 + 1) {
        pGVar25->IsInUse = false;
        pRVar28 = (live_glsl->RenderPasses).
                  super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (pRVar24 = (live_glsl->RenderPasses).
                       super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                       super__Vector_impl_data._M_start; pRVar24 != pRVar28; pRVar24 = pRVar24 + 1)
        {
          GVar20 = (*glad_glGetUniformLocation)
                             ((pRVar24->Program).Handle,(pGVar25->UniformName)._M_dataplus._M_p);
          pGVar25->IsInUse = (bool)(pGVar25->IsInUse | GVar20 != -1);
        }
      }
    }
    local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_finish = (GUITexture *)0x0;
    local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (GUITexture *)0x0;
    pRVar28 = (live_glsl->RenderPasses).super__Vector_base<RenderPass,_std::allocator<RenderPass>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    plVar12 = (long *)local_f0._0_8_;
    for (pRVar24 = (live_glsl->RenderPasses).
                   super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                   super__Vector_impl_data._M_start; pRVar24 != pRVar28; pRVar24 = pRVar24 + 1) {
      local_f0.Id = pRVar24->TextureId;
      if (local_f0.Id != 0) {
        uVar3 = pRVar24->Width;
        uVar8 = pRVar24->Height;
        plVar12 = (long *)CONCAT44(uVar3,local_f0.Id);
        local_f0.Height = uVar8;
        if (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_f0.Width = uVar3;
          std::vector<GUITexture,std::allocator<GUITexture>>::_M_realloc_insert<GUITexture_const&>
                    ((vector<GUITexture,std::allocator<GUITexture>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_f0);
          plVar12 = (long *)CONCAT44(local_f0.Width,local_f0.Id);
        }
        else {
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Height = uVar8;
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Id = local_f0.Id;
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Width = uVar3;
          local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      pTVar7 = (pRVar24->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pTVar27 = (pRVar24->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                     _M_impl.super__Vector_impl_data._M_start; pTVar27 != pTVar7;
          pTVar27 = pTVar27 + 1) {
        uVar4 = pTVar27->Width;
        uVar9 = pTVar27->Height;
        local_f0.Id = pTVar27->Id;
        local_f0.Width = uVar4;
        local_f0.Height = uVar9;
        if (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<GUITexture,std::allocator<GUITexture>>::_M_realloc_insert<GUITexture_const&>
                    ((vector<GUITexture,std::allocator<GUITexture>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_f0);
        }
        else {
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Height = uVar9;
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Id = local_f0.Id;
          (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
           super__Vector_impl_data._M_finish)->Width = uVar4;
          local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        plVar12 = (long *)CONCAT44(local_f0.Width,local_f0.Id);
      }
    }
    handle = live_glsl->GUI;
    local_f0._0_8_ = plVar12;
    std::vector<GUITexture,_std::allocator<GUITexture>_>::vector(&local_68,&local_b8);
    GUINewFrame(handle,&live_glsl->GUIComponents,&local_68);
    if (local_68.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (live_glsl->ShaderCompiled == true) {
      pRVar24 = (live_glsl->RenderPasses).
                super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_70 = (live_glsl->RenderPasses).
                 super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (pRVar24 == local_70) {
        live_glsl->IsContinuousRendering = false;
      }
      else {
        local_bc = 1.0;
        if (iVar19 != 1) {
          local_bc = 0.0;
        }
        do {
          puVar23 = &pRVar24->Height;
          puVar13 = &pRVar24->Width;
          if (pRVar24->IsMain != false) {
            puVar23 = local_80;
            puVar13 = local_78;
          }
          uVar1 = *puVar13;
          uVar2 = *puVar23;
          local_c8 = (pointer)CONCAT44(local_c8._4_4_,live_glsl->PixelDensity);
          (*glad_glBindFramebuffer)(0x8d40,pRVar24->FBO);
          (*glad_glClear)(0x4000);
          GVar22 = (pRVar24->Program).Handle;
          if (GVar22 == 0) {
            __assert_fail("render_pass.Program.Handle != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/liveglsl.cpp"
                          ,0xfb,"int LiveGLSLRender(LiveGLSL *)");
          }
          (*glad_glUseProgram)(GVar22);
          (*glad_glBindBuffer)(0x8892,live_glsl->VertexBufferId);
          fVar29 = (float)uVar1 * local_c8._0_4_;
          fVar30 = (float)uVar2 * local_c8._0_4_;
          (*glad_glViewport)(0,0,(GLsizei)(long)fVar29,(GLsizei)(long)fVar30);
          p_Var17 = glad_glUniform2f;
          GVar20 = (*glad_glGetUniformLocation)((pRVar24->Program).Handle,"resolution");
          (*p_Var17)(GVar20,(float)((long)fVar29 & 0xffffffff),(float)((long)fVar30 & 0xffffffff));
          p_Var15 = glad_glUniform1f;
          GVar20 = (*glad_glGetUniformLocation)((pRVar24->Program).Handle,"time");
          dVar10 = glfwGetTime();
          (*p_Var15)(GVar20,(float)dVar10);
          p_Var15 = glad_glUniform1f;
          GVar20 = (*glad_glGetUniformLocation)((pRVar24->Program).Handle,"pixel_ratio");
          (*p_Var15)(GVar20,live_glsl->PixelDensity);
          p_Var18 = glad_glUniform3f;
          GVar20 = (*glad_glGetUniformLocation)((pRVar24->Program).Handle,"mouse");
          (*p_Var18)(GVar20,(float)local_90,(float)local_98,local_bc);
          iVar19 = 0;
          if ((pRVar24->Input)._M_string_length != 0) {
            pRVar28 = (live_glsl->RenderPasses).
                      super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pRVar26 = (live_glsl->RenderPasses).
                      super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            iVar19 = 0;
            if (pRVar28 != pRVar26) {
              iVar19 = 0;
              local_c8 = pRVar26;
              do {
                __n = (pRVar28->Output)._M_string_length;
                if (__n == (pRVar24->Input)._M_string_length) {
                  if (__n != 0) {
                    iVar21 = bcmp((pRVar28->Output)._M_dataplus._M_p,
                                  (pRVar24->Input)._M_dataplus._M_p,__n);
                    if (iVar21 != 0) goto LAB_001137e0;
                  }
                  (*glad_glActiveTexture)(iVar19 + 0x84c0);
                  (*glad_glBindTexture)(0xde1,pRVar28->TextureId);
                  p_Var16 = glad_glUniform1i;
                  GVar20 = (*glad_glGetUniformLocation)
                                     ((pRVar24->Program).Handle,(pRVar24->Input)._M_dataplus._M_p);
                  (*p_Var16)(GVar20,iVar19);
                  p_Var17 = glad_glUniform2f;
                  p_Var14 = glad_glGetUniformLocation;
                  GVar22 = (pRVar24->Program).Handle;
                  local_f0._0_8_ = local_e0;
                  pcVar5 = (pRVar24->Input)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_f0,pcVar5,pcVar5 + (pRVar24->Input)._M_string_length);
                  std::__cxx11::string::append((char *)&local_f0);
                  GVar20 = (*p_Var14)(GVar22,(GLchar *)local_f0._0_8_);
                  (*p_Var17)(GVar20,(float)pRVar28->Width,(float)pRVar28->Height);
                  if ((long *)local_f0._0_8_ != local_e0) {
                    operator_delete((void *)local_f0._0_8_,local_e0[0] + 1);
                  }
                  iVar19 = iVar19 + 1;
                  pRVar26 = local_c8;
                }
LAB_001137e0:
                pRVar28 = pRVar28 + 1;
              } while (pRVar28 != pRVar26);
            }
          }
          pGVar6 = (live_glsl->GUIComponents).
                   super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pGVar25 = (live_glsl->GUIComponents).
                         super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>._M_impl.
                         super__Vector_impl_data._M_start; pGVar25 != pGVar6; pGVar25 = pGVar25 + 1)
          {
            GVar20 = (*glad_glGetUniformLocation)
                               ((pRVar24->Program).Handle,(pGVar25->UniformName)._M_dataplus._M_p);
            switch(pGVar25->UniformType) {
            case EGUIUniformTypeFloat:
              (*glad_glUniform1f)(GVar20,pGVar25->Data[0]);
              break;
            case EGUIUniformTypeVec2:
              (*glad_glUniform2f)(GVar20,pGVar25->Data[0],pGVar25->Data[1]);
              break;
            case EGUIUniformTypeVec3:
              (*glad_glUniform3f)(GVar20,pGVar25->Data[0],pGVar25->Data[1],pGVar25->Data[2]);
              break;
            case EGUIUniformTypeVec4:
              (*glad_glUniform4f)(GVar20,pGVar25->Data[0],pGVar25->Data[1],pGVar25->Data[2],
                                  pGVar25->Data[3]);
            }
          }
          pTVar27 = (pRVar24->Textures).super__Vector_base<Texture,_std::allocator<Texture>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          local_c8 = (pointer)(pRVar24->Textures).
                              super__Vector_base<Texture,_std::allocator<Texture>_>._M_impl.
                              super__Vector_impl_data._M_finish;
          if ((pointer)pTVar27 != local_c8) {
            do {
              (*glad_glActiveTexture)(iVar19 + 0x84c0);
              (*glad_glBindTexture)(0xde1,pTVar27->Id);
              p_Var16 = glad_glUniform1i;
              GVar20 = (*glad_glGetUniformLocation)
                                 ((pRVar24->Program).Handle,(pTVar27->Binding)._M_dataplus._M_p);
              (*p_Var16)(GVar20,iVar19);
              p_Var17 = glad_glUniform2f;
              p_Var14 = glad_glGetUniformLocation;
              GVar22 = (pRVar24->Program).Handle;
              local_f0._0_8_ = local_e0;
              pcVar5 = (pTVar27->Binding)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,pcVar5,pcVar5 + (pTVar27->Binding)._M_string_length);
              std::__cxx11::string::append((char *)&local_f0);
              GVar20 = (*p_Var14)(GVar22,(GLchar *)local_f0._0_8_);
              (*p_Var17)(GVar20,(float)pTVar27->Width,(float)pTVar27->Height);
              if ((long *)local_f0._0_8_ != local_e0) {
                operator_delete((void *)local_f0._0_8_,local_e0[0] + 1);
              }
              iVar19 = iVar19 + 1;
              pTVar27 = pTVar27 + 1;
            } while ((pointer)pTVar27 != local_c8);
          }
          (*glad_glBindVertexArray)(live_glsl->VaoId);
          pRVar26 = (live_glsl->RenderPasses).
                    super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          for (pRVar28 = (live_glsl->RenderPasses).
                         super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                         super__Vector_impl_data._M_start; pRVar28 != pRVar26; pRVar28 = pRVar28 + 1
              ) {
            if (pRVar28->IsMain == true) {
              GVar22 = (*glad_glGetAttribLocation)((pRVar28->Program).Handle,"position");
              (*glad_glVertexAttribPointer)(GVar22,2,0x1406,'\0',8,(void *)0x0);
              (*glad_glEnableVertexAttribArray)(GVar22);
            }
          }
          (*glad_glDrawArrays)(4,0,6);
          pRVar24 = pRVar24 + 1;
        } while (pRVar24 != local_70);
        pRVar24 = (live_glsl->RenderPasses).
                  super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pRVar28 = (live_glsl->RenderPasses).
                  super__Vector_base<RenderPass,_std::allocator<RenderPass>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        live_glsl->IsContinuousRendering = false;
        for (; pRVar24 != pRVar28; pRVar24 = pRVar24 + 1) {
          GVar20 = (*glad_glGetUniformLocation)((pRVar24->Program).Handle,"time");
          live_glsl->IsContinuousRendering = (bool)(live_glsl->IsContinuousRendering | GVar20 != -1)
          ;
        }
      }
      if ((live_glsl->Args).Output._M_string_length == 0) goto LAB_00113b6e;
      iVar19 = (int)(long)((float)live_glsl->WindowWidth * live_glsl->PixelDensity);
      y_00 = (GLsizei)(long)((float)live_glsl->WindowHeight * live_glsl->PixelDensity);
      data = operator_new__((ulong)(uint)(iVar19 * 3 * y_00));
      (*glad_glReadPixels)(0,0,iVar19,y_00,0x1907,0x1401,data);
      iVar19 = stbi_write_png((local_88->_M_dataplus)._M_p,iVar19,y_00,3,data,iVar19 * 3);
      operator_delete__(data);
      bVar11 = false;
      local_cc = 0;
      if (iVar19 == 0) {
        LiveGLSLRender();
        local_cc = 1;
        bVar11 = false;
      }
    }
    else {
      (*glad_glBindFramebuffer)(0x8d40,0);
      (*glad_glClear)(0x4000);
LAB_00113b6e:
      GUIRender(live_glsl->GUI);
      glfwSwapBuffers(live_glsl->GLFWWindowHandle);
      if (live_glsl->IsContinuousRendering == true) {
        bVar11 = true;
        glfwPollEvents();
      }
      else {
        bVar11 = true;
        glfwWaitEvents();
      }
    }
    if (local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<GUITexture,_std::allocator<GUITexture>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (!bVar11) {
      return local_cc;
    }
  } while( true );
}

Assistant:

int LiveGLSLRender(LiveGLSL* live_glsl) {
    double previous_time = glfwGetTime();
    uint32_t frame_count = 0;

    while (!glfwWindowShouldClose(live_glsl->GLFWWindowHandle)) {
        ReloadShaderIfChanged(live_glsl, live_glsl->ShaderPath);

        double x, y;
        glfwGetCursorPos(live_glsl->GLFWWindowHandle, &x, &y);
        x *= live_glsl->PixelDensity;
        y *= live_glsl->PixelDensity;

        int mouse_left_state = glfwGetMouseButton(live_glsl->GLFWWindowHandle, GLFW_MOUSE_BUTTON_LEFT);

        if (live_glsl->ShaderCompiled) {
            for (GUIComponent& gui_component : live_glsl->GUIComponents) {
                gui_component.IsInUse = false;
                for (const auto& render_pass : live_glsl->RenderPasses) {
                    GLuint uniform_location = glGetUniformLocation(render_pass.Program.Handle, gui_component.UniformName.c_str());
                    gui_component.IsInUse |= uniform_location != -1;
                }
            }
        }

        std::vector<GUITexture> textures;
        for (const auto& render_pass : live_glsl->RenderPasses) {
            if (render_pass.TextureId) {
                GUITexture guiTexture;
                guiTexture.Width = render_pass.Width;
                guiTexture.Height = render_pass.Height;
                guiTexture.Id = render_pass.TextureId;
                textures.push_back(guiTexture);
            }
            for (const auto& texture : render_pass.Textures) {
                GUITexture guiTexture;
                guiTexture.Width = texture.Width;
                guiTexture.Height = texture.Height;
                guiTexture.Id = texture.Id;
                textures.push_back(guiTexture);
            }
        }

        GUINewFrame(live_glsl->GUI, live_glsl->GUIComponents, textures);

        if (live_glsl->ShaderCompiled) {
            for (const auto& render_pass : live_glsl->RenderPasses) {
                uint32_t width = render_pass.IsMain ? live_glsl->WindowWidth : render_pass.Width;
                uint32_t height = render_pass.IsMain ? live_glsl->WindowHeight : render_pass.Height;

                width *= live_glsl->PixelDensity;
                height *= live_glsl->PixelDensity;

                glBindFramebuffer(GL_FRAMEBUFFER, render_pass.FBO);
                glClear(GL_COLOR_BUFFER_BIT);

                assert(render_pass.Program.Handle != 0);
                glUseProgram(render_pass.Program.Handle);

                glBindBuffer(GL_ARRAY_BUFFER, live_glsl->VertexBufferId);
                glViewport(0, 0, width, height);

                glUniform2f(glGetUniformLocation(render_pass.Program.Handle, "resolution"), width, height);
                glUniform1f(glGetUniformLocation(render_pass.Program.Handle, "time"), glfwGetTime());
                glUniform1f(glGetUniformLocation(render_pass.Program.Handle, "pixel_ratio"), live_glsl->PixelDensity);
                // Mouse position, x relative to left, y relative to top
                glUniform3f(glGetUniformLocation(render_pass.Program.Handle, "mouse"), x, y, mouse_left_state == GLFW_PRESS ? 1.0f : 0.0f);

                int texture_unit = 0;

                if (!render_pass.Input.empty()) {
                    for (const auto& other : live_glsl->RenderPasses) {
                        if (other.Output == render_pass.Input) {
                            glActiveTexture(GL_TEXTURE0 + texture_unit);
                            glBindTexture(GL_TEXTURE_2D, other.TextureId);
                            glUniform1i(glGetUniformLocation(render_pass.Program.Handle, render_pass.Input.c_str()), texture_unit);
                            glUniform2f(glGetUniformLocation(render_pass.Program.Handle, (render_pass.Input + "_resolution").c_str()), other.Width, other.Height);
                            ++texture_unit;
                        }
                    }
                }

                for (const GUIComponent& gui_component : live_glsl->GUIComponents) {
                    GLuint uniform_location = glGetUniformLocation(render_pass.Program.Handle, gui_component.UniformName.c_str());
                    switch (gui_component.UniformType) {
                        case EGUIUniformTypeFloat:
                            glUniform1f(uniform_location, gui_component.Data[0]);
                            break;
                        case EGUIUniformTypeVec2:
                            glUniform2f(uniform_location, gui_component.Data[0], gui_component.Data[1]);
                            break;
                        case EGUIUniformTypeVec3:
                            glUniform3f(uniform_location, gui_component.Data[0], gui_component.Data[1], gui_component.Data[2]);
                            break;
                        case EGUIUniformTypeVec4:
                            glUniform4f(uniform_location, gui_component.Data[0], gui_component.Data[1], gui_component.Data[2], gui_component.Data[3]);
                            break;
                    }
                }

                for (const Texture& texture : render_pass.Textures) {
                    glActiveTexture(GL_TEXTURE0 + texture_unit);
                    glBindTexture(GL_TEXTURE_2D, texture.Id);
                    glUniform1i(glGetUniformLocation(render_pass.Program.Handle, texture.Binding.c_str()), texture_unit);
                    glUniform2f(glGetUniformLocation(render_pass.Program.Handle, (texture.Binding + "_resolution").c_str()), texture.Width, texture.Height);
                    ++texture_unit;
                }

                glBindVertexArray(live_glsl->VaoId);

                for (auto& render_pass : live_glsl->RenderPasses) {
                    if (render_pass.IsMain) {
                        GLint position_attrib = glGetAttribLocation(render_pass.Program.Handle, "position");
                        glVertexAttribPointer(position_attrib, 2, GL_FLOAT, GL_FALSE, 2 * sizeof(float), 0);
                        glEnableVertexAttribArray(position_attrib);
                    }
                }

                glDrawArrays(GL_TRIANGLES, 0, 6);
            }

            live_glsl->IsContinuousRendering = false;
            for (const auto& render_pass : live_glsl->RenderPasses) {
                live_glsl->IsContinuousRendering |= glGetUniformLocation(render_pass.Program.Handle, "time") != -1;
            }

            if (!live_glsl->Args.Output.empty()) {
                uint32_t width = live_glsl->WindowWidth * live_glsl->PixelDensity;
                uint32_t height = live_glsl->WindowHeight * live_glsl->PixelDensity;
                unsigned char* pixels = new unsigned char[3 * width * height];
                glReadPixels(0, 0, width, height, GL_RGB, GL_UNSIGNED_BYTE, pixels);

                int res = stbi_write_png(live_glsl->Args.Output.c_str(), width, height, 3, pixels, 3 * width);
                delete[] pixels;
                if (res == 0) {
                    fprintf(stderr, "Failed to write image to file: %s\n", live_glsl->Args.Output.c_str());
                    return EXIT_FAILURE;
                }
                return EXIT_SUCCESS;
            }
        } else {
            glBindFramebuffer(GL_FRAMEBUFFER, 0);
            glClear(GL_COLOR_BUFFER_BIT);
        }
        
        GUIRender(live_glsl->GUI);

        glfwSwapBuffers(live_glsl->GLFWWindowHandle);

        if (live_glsl->IsContinuousRendering) {
            glfwPollEvents();
        } else {
            glfwWaitEvents();
        }
    }

    return EXIT_SUCCESS;
}